

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O0

void MListSetAt(Col_Word *nodePtr,size_t index,Col_Word element)

{
  uint local_3c;
  uint local_38;
  uint local_34;
  ulong local_30;
  Col_Word core;
  size_t leftLength;
  Col_Word element_local;
  size_t index_local;
  Col_Word *nodePtr_local;
  
  leftLength = element;
  element_local = index;
  index_local = (size_t)nodePtr;
LAB_0011b044:
  if (*(long *)index_local == 0) {
    local_34 = 0;
  }
  else {
    if ((*(ulong *)index_local & 0xf) == 0) {
      if ((**(byte **)index_local & 2) == 0) {
        local_3c = 0xffffffff;
      }
      else {
        local_3c = **(byte **)index_local & 0xfffffffe;
      }
      local_38 = local_3c;
    }
    else {
      local_38 = immediateWordTypes[*(ulong *)index_local & 0x1f];
    }
    local_34 = local_38;
  }
  switch(local_34) {
  case 0x1a:
    *(size_t *)(*(long *)index_local + 0x10 + element_local * 8) = leftLength;
    return;
  case 0x1e:
    if (*(char *)(*(long *)index_local + 1) != '\0') {
      ConvertToMConcatNode((Col_Word *)index_local);
      goto LAB_0011b044;
    }
    break;
  case 0x22:
    goto switchD_0011b0e1_caseD_22;
  case 0x26:
    core = (Col_Word)*(ushort *)(*(long *)index_local + 2);
    if (core == 0) {
      core = Col_ListLength(*(Col_Word *)(*(long *)index_local + 0x10));
    }
    if (element_local < core) {
      MListSetAt((Col_Word *)(*(long *)index_local + 0x10),element_local,leftLength);
    }
    else {
      MListSetAt((Col_Word *)(*(long *)index_local + 0x18),element_local - core,leftLength);
    }
    UpdateMConcatNode(*(Col_Word *)index_local);
    return;
  case 0xfffffffa:
    local_30 = *(ulong *)index_local & 0xfffffffffffffff7;
    MListSetAt(&local_30,element_local,leftLength);
    *(ulong *)index_local = local_30 | 8;
    return;
  }
  ConvertToMutableAt((Col_Word *)index_local,element_local);
  goto LAB_0011b044;
switchD_0011b0e1_caseD_22:
  ConvertToMConcatNode((Col_Word *)index_local);
  goto LAB_0011b044;
}

Assistant:

static void
MListSetAt(
    Col_Word * nodePtr, /*!< [in,out] Mutable list node to modify. May be
                             overwritten if converted to mutable. */
    size_t index,       /*!< Element index. */
    Col_Word element)   /*!< New element. */
{
    /*
     * Entry point for tail recursive calls.
     */

start:
    switch (WORD_TYPE(*nodePtr)) {
    /*
     * First mutable types...
     */

    case WORD_TYPE_MCONCATLIST: {
        size_t leftLength = WORD_CONCATLIST_LEFT_LENGTH(*nodePtr);
        if (leftLength == 0) {
            leftLength = Col_ListLength(WORD_CONCATLIST_LEFT(*nodePtr));
        }
        if (index < leftLength) {
            /*
             * Recurse on left.
             */

            MListSetAt(&WORD_CONCATLIST_LEFT(*nodePtr), index, element);
        } else {
            /*
             * Recurse on right.
             */

            MListSetAt(&WORD_CONCATLIST_RIGHT(*nodePtr), index - leftLength,
                    element);
        }

        /*
         * Update & rebalance tree.
         */

        UpdateMConcatNode(*nodePtr);
        return;
        }

    case WORD_TYPE_CIRCLIST: {
        /*
         * Recurse on core.
         */

        Col_Word core = WORD_CIRCLIST_CORE(*nodePtr);
        MListSetAt(&core, index, element);
        *nodePtr = WORD_CIRCLIST_NEW(core);
        return;
        }

    case WORD_TYPE_MVECTOR:
        /*
         * Set element.
         */

        WORD_VECTOR_ELEMENTS(*nodePtr)[index] = element;
        return;

    /*
     * ... then immediate and immutable types.
     */

    case WORD_TYPE_CONCATLIST:
        /*
         * Convert to mutable concat then retry.
         */

        ConvertToMConcatNode(nodePtr);
        goto start;

    case WORD_TYPE_SUBLIST:
        if (WORD_SUBLIST_DEPTH(*nodePtr) >= 1) {
            /*
             * Source is concat. Convert to mutable then retry.
             */

            ConvertToMConcatNode(nodePtr);
            goto start;
        }
        /* continued. */
    default:
        /*
         * Convert to mutable around index then retry.
         */

        ConvertToMutableAt(nodePtr, index);
        goto start;
    }
}